

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O0

void TasGrid::RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)2>
               (int max_order,int num_rows,vector<int,_std::allocator<int>_> *pntr,
               vector<int,_std::allocator<int>_> *indx,vector<double,_std::allocator<double>_> *vals
               )

{
  pointer *this;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<double> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<double> __l_06;
  initializer_list<int> __l_07;
  vector<double,std::allocator<double>> *pvVar1;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  value_type_conflict2 local_2a0;
  double *local_298;
  undefined1 local_290 [16];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_280;
  const_iterator local_278;
  double local_270;
  double local_268;
  value_type_conflict2 local_260;
  int *local_258;
  undefined1 local_250 [16];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_240;
  const_iterator local_238;
  value_type_conflict3 local_22c [3];
  double local_220;
  int local_218;
  int local_214;
  int dad;
  int kid;
  double x;
  undefined1 local_200 [4];
  int r;
  vector<double,_std::allocator<double>_> ancestors_vals;
  vector<int,_std::allocator<int>_> ancestors;
  int local_1c8;
  value_type_conflict3 local_1c4;
  int i_1;
  value_type_conflict3 i;
  iterator __end6;
  iterator __begin6;
  undefined8 local_1a4;
  undefined4 local_19c;
  array<int,_5UL> *local_198;
  array<int,_5UL> *__range6;
  allocator<int> local_17d;
  value_type_conflict3 local_17c;
  vector<int,_std::allocator<int>_> local_178;
  int local_160 [4];
  iterator local_150;
  undefined8 local_148;
  double local_140 [5];
  iterator local_118;
  undefined8 local_110;
  int local_104 [5];
  iterator local_f0;
  undefined8 local_e8;
  int local_dc [3];
  iterator local_d0;
  undefined8 local_c8;
  double local_c0 [3];
  iterator local_a8;
  undefined8 local_a0;
  int local_94 [3];
  iterator local_88;
  undefined8 local_80;
  int local_78 [2];
  iterator local_70;
  undefined8 local_68;
  double local_60;
  iterator local_58;
  undefined8 local_50;
  int local_44;
  iterator local_40;
  undefined8 local_38;
  int local_2c;
  vector<double,std::allocator<double>> *pvStack_28;
  int max_level;
  vector<double,_std::allocator<double>_> *vals_local;
  vector<int,_std::allocator<int>_> *indx_local;
  vector<int,_std::allocator<int>_> *pntr_local;
  int num_rows_local;
  int max_order_local;
  
  pvStack_28 = (vector<double,std::allocator<double>> *)vals;
  vals_local = (vector<double,_std::allocator<double>_> *)indx;
  indx_local = pntr;
  pntr_local._0_4_ = num_rows;
  pntr_local._4_4_ = max_order;
  local_2c = getLevel<(TasGrid::RuleLocal::erule)2>(num_rows);
  if ((int)pntr_local == 0) {
    local_44 = 0;
    local_40 = &local_44;
    local_38 = 1;
    __l_07._M_len = 1;
    __l_07._M_array = local_40;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)vals_local,__l_07);
    local_60 = 1.0;
    local_58 = &local_60;
    local_50 = 1;
    __l_06._M_len = 1;
    __l_06._M_array = local_58;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)pvStack_28,__l_06);
    local_78[0] = 0;
    local_78[1] = 1;
    local_70 = local_78;
    local_68 = 2;
    __l_05._M_len = 2;
    __l_05._M_array = local_70;
    std::vector<int,_std::allocator<int>_>::operator=(indx_local,__l_05);
  }
  else if ((int)pntr_local == 1) {
    local_94[0] = 0;
    local_94[1] = 0;
    local_94[2] = 1;
    local_88 = local_94;
    local_80 = 3;
    __l_04._M_len = 3;
    __l_04._M_array = local_88;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)vals_local,__l_04);
    local_c0[0] = 1.0;
    local_c0[1] = 1.0;
    local_c0[2] = 1.0;
    local_a8 = local_c0;
    local_a0 = 3;
    __l_03._M_len = 3;
    __l_03._M_array = local_a8;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)pvStack_28,__l_03);
    local_dc[0] = 0;
    local_dc[1] = 1;
    local_dc[2] = 3;
    local_d0 = local_dc;
    local_c8 = 3;
    __l_02._M_len = 3;
    __l_02._M_array = local_d0;
    std::vector<int,_std::allocator<int>_>::operator=(indx_local,__l_02);
  }
  else if ((int)pntr_local == 2) {
    local_104[0] = 0;
    local_104[1] = 0;
    local_104[2] = 1;
    local_104[3] = 0;
    local_104[4] = 2;
    local_f0 = local_104;
    local_e8 = 5;
    __l_01._M_len = 5;
    __l_01._M_array = local_f0;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)vals_local,__l_01);
    memcpy(local_140,&DAT_00300b28,0x28);
    local_118 = local_140;
    local_110 = 5;
    __l_00._M_len = 5;
    __l_00._M_array = local_118;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)pvStack_28,__l_00);
    local_160[0] = 0;
    local_160[1] = 1;
    local_160[2] = 3;
    local_160[3] = 5;
    local_150 = local_160;
    local_148 = 4;
    __l._M_len = 4;
    __l._M_array = local_150;
    std::vector<int,_std::allocator<int>_>::operator=(indx_local,__l);
  }
  else {
    ::std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)vals_local)
    ;
    ::std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)vals_local,(long)((int)pntr_local * local_2c));
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)pvStack_28);
    ::std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)pvStack_28,
               (long)((int)pntr_local * local_2c));
    iVar2 = (int)pntr_local + 1;
    local_17c = 0;
    ::std::allocator<int>::allocator(&local_17d);
    ::std::vector<int,_std::allocator<int>_>::vector(&local_178,(long)iVar2,&local_17c,&local_17d);
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)indx_local,&local_178);
    ::std::vector<int,_std::allocator<int>_>::~vector(&local_178);
    ::std::allocator<int>::~allocator(&local_17d);
    stack0xfffffffffffffe54 = 0;
    local_1a4 = 1;
    local_19c = 2;
    local_198 = (array<int,_5UL> *)((long)&__begin6 + 4);
    __end6 = std::array<int,_5UL>::begin(local_198);
    _i_1 = std::array<int,_5UL>::end(local_198);
    for (; __end6 != _i_1; __end6 = __end6 + 1) {
      local_1c4 = *__end6;
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)vals_local,&local_1c4);
    }
    for (local_1c8 = 0; local_1c8 < 5; local_1c8 = local_1c8 + 1) {
      ancestors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)pvStack_28,
                 (value_type_conflict2 *)
                 &ancestors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)indx_local,1);
    *pvVar3 = 1;
    pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)indx_local,2);
    *pvVar3 = 3;
    this = &ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_200);
    ::std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)this,(long)local_2c);
    ::std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)local_200,(long)local_2c);
    for (x._4_4_ = 3; x._4_4_ < (int)pntr_local; x._4_4_ = x._4_4_ + 1) {
      sVar4 = ::std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)vals_local);
      pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)indx_local,(long)x._4_4_);
      *pvVar3 = (value_type)sVar4;
      _dad = getNode<(TasGrid::RuleLocal::erule)2>(x._4_4_);
      ::std::vector<int,_std::allocator<int>_>::clear
                ((vector<int,_std::allocator<int>_> *)
                 &ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)local_200);
      local_214 = x._4_4_;
      while (local_218 = (local_214 + 1) / 2, 2 < local_218) {
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_218);
        local_220 = evalRaw<(TasGrid::RuleLocal::erule)2>(pntr_local._4_4_,local_218,_dad);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_200,&local_220);
        local_214 = local_218;
      }
      local_22c[2] = 0;
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)vals_local,local_22c + 2);
      local_22c[1] = 1;
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)vals_local,local_22c + 1);
      local_22c[0] = 2;
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)vals_local,local_22c);
      this_00 = vals_local;
      local_240._M_current =
           (int *)::std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)vals_local);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_238,
                 &local_240);
      ::std::vector<int,_std::allocator<int>_>::rbegin
                ((vector<int,_std::allocator<int>_> *)(local_250 + 8));
      std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_250);
      local_258 = (int *)::std::vector<int,std::allocator<int>>::
                         insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,void>
                                   ((vector<int,std::allocator<int>> *)this_00,local_238,
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)(local_250 + 8),
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_250);
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)vals_local,
                 (value_type_conflict3 *)((long)&x + 4));
      local_260 = 1.0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)pvStack_28,&local_260);
      pvVar1 = pvStack_28;
      local_268 = evalRaw<(TasGrid::RuleLocal::erule)2>(pntr_local._4_4_,1,_dad);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)pvVar1,&local_268);
      pvVar1 = pvStack_28;
      local_270 = evalRaw<(TasGrid::RuleLocal::erule)2>(pntr_local._4_4_,2,_dad);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)pvVar1,&local_270);
      pvVar1 = pvStack_28;
      local_280._M_current =
           (double *)
           ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)pvStack_28);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                 &local_278,&local_280);
      std::vector<double,_std::allocator<double>_>::rbegin
                ((vector<double,_std::allocator<double>_> *)(local_290 + 8));
      std::vector<double,_std::allocator<double>_>::rend
                ((vector<double,_std::allocator<double>_> *)local_290);
      local_298 = (double *)
                  ::std::vector<double,std::allocator<double>>::
                  insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,void>
                            (pvVar1,local_278,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                              *)(local_290 + 8),
                             (reverse_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                              *)local_290);
      local_2a0 = 1.0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)pvStack_28,&local_2a0);
    }
    sVar4 = ::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)vals_local);
    pvVar3 = ::std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)indx_local);
    *pvVar3 = (value_type)sVar4;
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_200);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void van_matrix(int max_order, int num_rows, std::vector<int> &pntr, std::vector<int> &indx, std::vector<double> &vals) {
        int max_level = getLevel<effrule>(num_rows);

        if (effrule == erule::pwc) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(size_t i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        ancestors.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            int kid = r;
                            int dad = kid / 3;
                            while(dad != 0) {
                                if (dad % 2 == 0) {
                                    if (kid != 3 * dad)
                                        ancestors.push_back(dad);
                                } else {
                                    if (kid != 3 * dad + 2)
                                        ancestors.push_back(dad);
                                }
                                kid = dad;
                                dad = kid / 3;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            for(size_t i=0; i<ancestors.size() + 2; i++)
                                vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            if (kid < 4) dad--;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                                if (kid < 4) dad--;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::semilocalp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(int i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 2) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.push_back(2);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 2, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp0) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid - 1) / 2;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid - 1) / 2;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else { // if (effrule == erule::localpb) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 1};
                    vals = {1.0, 1.0};
                    pntr = {0, 1, 2};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    indx.push_back(1);
                    vals.push_back(1.0);
                    vals.push_back(1.0);
                    pntr[1] = 1;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=2; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 1) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        }
    }